

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::dispose(ArrayBuilder<kj::Exception::Detail> *this)

{
  Detail *pDVar1;
  RemoveConst<kj::Exception::Detail> *pRVar2;
  Detail *pDVar3;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (Detail *)0x0) {
    pRVar2 = this->pos;
    pDVar3 = this->endPtr;
    this->endPtr = (Detail *)0x0;
    this->ptr = (Detail *)0x0;
    this->pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pDVar1,0x20,(long)pRVar2 - (long)pDVar1 >> 5,
               (long)pDVar3 - (long)pDVar1 >> 5,
               ArrayDisposer::Dispose_<kj::Exception::Detail>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }